

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solver.cpp
# Opt level: O3

void __thiscall Solver::solve(Solver *this,int algorithm)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
  *pmVar1;
  _Rb_tree_header *p_Var2;
  pointer pBVar3;
  Block block;
  Block block_00;
  Block block_01;
  Block block_02;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  undefined4 uVar10;
  undefined4 uVar11;
  undefined4 uVar12;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  _Elt_pointer pBVar20;
  _Elt_pointer pBVar21;
  _Elt_pointer pBVar22;
  _Map_pointer ppBVar23;
  bool bVar24;
  bool bVar25;
  uint uVar26;
  mapped_type *pmVar27;
  ulong uVar28;
  iterator iVar29;
  mapped_type *pmVar30;
  ulong uVar31;
  Board *pBVar32;
  bool bVar33;
  Solver *pSVar34;
  long lVar35;
  Board *pBVar36;
  int iVar37;
  ulong uVar38;
  long lVar39;
  _Map_pointer ppBStack_6f0;
  Board *pBStack_6e8;
  _Deque_iterator<Board,_Board_&,_Board_*> _Stack_6d0;
  priority_queue<Board,_std::deque<Board,_std::allocator<Board>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_karakanb[P]unblock_me_solver_src_Solver_cpp:180:16)>
  pStack_6b0;
  vector<Block,_std::allocator<Block>_> *pvStack_658;
  _Alloc_hider *p_Stack_650;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_648;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_640;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_638;
  char *pcStack_630;
  _Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_karakanb[P]unblock_me_solver_src_Solver_cpp:180:16)>
  _Stack_628;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_620;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_618;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_610;
  undefined1 auStack_5a0 [16];
  _Alloc_hider *p_Stack_590;
  key_type *pkStack_588;
  Solver *pSStack_580;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_578;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_570;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_568;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_560;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_558;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paStack_550;
  int aiStack_548 [2];
  int aiStack_540 [2];
  int iStack_538;
  int aiStack_528 [2];
  int aiStack_520 [2];
  int iStack_518;
  undefined1 auStack_510 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_500;
  _Alloc_hider _Stack_4f0;
  size_type sStack_4e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aStack_4e0;
  vector<Block,_std::allocator<Block>_> vStack_4d0;
  undefined1 auStack_4b8 [24];
  _Elt_pointer pBStack_4a0;
  _Elt_pointer pBStack_498;
  _Base_ptr p_Stack_490;
  _Elt_pointer pBStack_488;
  _Elt_pointer pBStack_480;
  _Elt_pointer pBStack_478;
  pointer pBStack_470;
  key_type kStack_428;
  _Alloc_hider a_Stack_408 [2];
  char acStack_3f8 [16];
  vector<Block,_std::allocator<Block>_> vStack_3e8;
  undefined1 auStack_3d0 [144];
  key_type kStack_340;
  _Alloc_hider a_Stack_320 [2];
  char acStack_310 [16];
  vector<Block,_std::allocator<Block>_> vStack_300;
  Board BStack_2e8;
  Board BStack_200;
  Board BStack_118;
  
  if (algorithm == 1) {
    vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    aStack_4e0._8_8_ = (Board *)0x0;
    vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    sStack_4e8 = 0;
    aStack_4e0._M_allocated_capacity = 0;
    aStack_500._8_8_ = (Board *)0x0;
    _Stack_4f0._M_p = (pointer)0x0;
    auStack_510._8_8_ = 0;
    aStack_500._M_allocated_capacity = 0;
    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x108674;
    std::_Deque_base<Board,_std::allocator<Board>_>::_M_initialize_map
              ((_Deque_base<Board,_std::allocator<Board>_> *)(auStack_510 + 8),0);
    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x108680;
    std::deque<Board,_std::allocator<Board>_>::push_back
              ((deque<Board,_std::allocator<Board>_> *)(auStack_510 + 8),&this->board);
    auStack_5a0._8_8_ = &vStack_300;
    paStack_550 = &BStack_200.referrer.field_2;
    paStack_558 = &BStack_118.referrer.field_2;
    pkStack_588 = &kStack_340;
    p_Stack_590 = a_Stack_320;
    paStack_570 = &BStack_2e8.referrer.field_2;
    paStack_560 = &BStack_200.identifier.field_2;
    paStack_568 = &BStack_118.identifier.field_2;
    paStack_578 = &BStack_2e8.identifier.field_2;
    pmVar1 = &this->pastSteps;
    auStack_5a0._0_8_ = &(this->pastSteps)._M_t._M_impl.super__Rb_tree_header;
    pSStack_580 = this;
    do {
      if (aStack_4e0._8_8_ == aStack_500._8_8_) break;
      paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x10879b;
      Board::Board((Board *)auStack_3d0,(Board *)aStack_500._8_8_);
      paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1087a8;
      std::deque<Board,_std::allocator<Board>_>::pop_front
                ((deque<Board,_std::allocator<Board>_> *)(auStack_510 + 8));
      paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x1087b0;
      bVar24 = Board::isCompleted((Board *)auStack_3d0);
      if (bVar24) {
        paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x1087cb;
        Board::Board(&BStack_2e8,(Board *)auStack_3d0);
        paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x1087db;
        constructSolutionSteps(this,&BStack_2e8);
        if (BStack_2e8.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x1087ed;
          operator_delete(BStack_2e8.blocks.super__Vector_base<Block,_std::allocator<Block>_>.
                          _M_impl.super__Vector_impl_data._M_start);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)BStack_2e8.referrer._M_dataplus._M_p != paStack_570) {
          paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x108804;
          operator_delete(BStack_2e8.referrer._M_dataplus._M_p);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)BStack_2e8.identifier._M_dataplus._M_p != paStack_578) {
          paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x10881f;
          operator_delete(BStack_2e8.identifier._M_dataplus._M_p);
        }
      }
      else {
        if (vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
            super__Vector_impl_data._M_finish !=
            vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
            super__Vector_impl_data._M_start) {
          uVar38 = 0;
          do {
            paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)0x108851;
            bVar25 = Block::isHorizontal(vStack_300.
                                         super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                                         super__Vector_impl_data._M_start + uVar38);
            if (bVar25) {
              iVar37 = 0;
              bVar25 = true;
              do {
                bVar33 = bVar25;
                pBVar3 = vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar38;
                aiStack_528[0] = pBVar3->id;
                aiStack_528[1] = pBVar3->row;
                aiStack_520[0] = pBVar3->column;
                aiStack_520[1] = pBVar3->length;
                uVar4 = pBVar3->id;
                uVar5 = pBVar3->row;
                uVar6 = pBVar3->column;
                uVar7 = pBVar3->length;
                block_01.length = uVar7;
                block_01.column = uVar6;
                block_01.row = uVar5;
                block_01.id = uVar4;
                iStack_518 = vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar38].direction;
                paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x1088a0;
                block_01.direction = iStack_518;
                bVar25 = Board::canMove((Board *)auStack_3d0,block_01,iVar37);
                if (bVar25) {
                  paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x1088bb;
                  pSVar34 = (Solver *)auStack_3d0;
                  Board::Board(&BStack_118,(Board *)auStack_3d0);
                  paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x1088d1;
                  createMovedInstance((Board *)auStack_4b8,pSVar34,&BStack_118,(int)uVar38,iVar37);
                  if (BStack_118.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x1088e3;
                    operator_delete(BStack_118.blocks.
                                    super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                                    super__Vector_impl_data._M_start);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)BStack_118.referrer._M_dataplus._M_p != paStack_558) {
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x1088fa;
                    operator_delete(BStack_118.referrer._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)BStack_118.identifier._M_dataplus._M_p != paStack_568) {
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x108911;
                    operator_delete(BStack_118.identifier._M_dataplus._M_p);
                  }
                  paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x108920;
                  iVar29 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                           ::find(&pmVar1->_M_t,&kStack_428);
                  if (iVar29._M_node == (_Base_ptr)auStack_5a0._0_8_) {
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x108936;
                    pmVar30 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                              ::operator[](pmVar1,&kStack_428);
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x10894e;
                    memcpy(pmVar30,auStack_4b8,0x90);
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x10895f;
                    std::__cxx11::string::_M_assign((string *)&pmVar30->identifier);
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x108970;
                    std::__cxx11::string::_M_assign((string *)&pmVar30->referrer);
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x108984;
                    std::vector<Block,_std::allocator<Block>_>::operator=
                              (&pmVar30->blocks,&vStack_3e8);
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x108999;
                    std::deque<Board,_std::allocator<Board>_>::push_front
                              ((deque<Board,_std::allocator<Board>_> *)(auStack_510 + 8),
                               (value_type *)auStack_4b8);
                  }
                  if (vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x1089ab;
                    operator_delete(vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (a_Stack_408[0]._M_p != acStack_3f8) {
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x1089bf;
                    operator_delete(a_Stack_408[0]._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)kStack_428._M_dataplus._M_p != &kStack_428.field_2) {
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x1089d3;
                    operator_delete(kStack_428._M_dataplus._M_p);
                  }
                }
                iVar37 = 1;
                bVar25 = false;
              } while (bVar33);
            }
            else {
              iVar37 = 2;
              do {
                pBVar3 = vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                         super__Vector_impl_data._M_start + uVar38;
                aiStack_548[0] = pBVar3->id;
                aiStack_548[1] = pBVar3->row;
                aiStack_540[0] = pBVar3->column;
                aiStack_540[1] = pBVar3->length;
                uVar8 = pBVar3->id;
                uVar9 = pBVar3->row;
                uVar10 = pBVar3->column;
                uVar11 = pBVar3->length;
                block_02.length = uVar11;
                block_02.column = uVar10;
                block_02.row = uVar9;
                block_02.id = uVar8;
                iStack_538 = vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                             super__Vector_impl_data._M_start[uVar38].direction;
                paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)0x108a34;
                block_02.direction = iStack_538;
                bVar25 = Board::canMove((Board *)auStack_3d0,block_02,iVar37);
                if (bVar25) {
                  paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x108a4f;
                  pSVar34 = (Solver *)auStack_3d0;
                  Board::Board(&BStack_200,(Board *)auStack_3d0);
                  paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x108a65;
                  createMovedInstance((Board *)auStack_4b8,pSVar34,&BStack_200,(int)uVar38,iVar37);
                  if (BStack_200.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x108a77;
                    operator_delete(BStack_200.blocks.
                                    super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                                    super__Vector_impl_data._M_start);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)BStack_200.referrer._M_dataplus._M_p != paStack_550) {
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x108a8e;
                    operator_delete(BStack_200.referrer._M_dataplus._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)BStack_200.identifier._M_dataplus._M_p != paStack_560) {
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x108aa5;
                    operator_delete(BStack_200.identifier._M_dataplus._M_p);
                  }
                  paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)0x108ab4;
                  iVar29 = std::
                           _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                           ::find(&pmVar1->_M_t,&kStack_428);
                  if (iVar29._M_node == (_Base_ptr)auStack_5a0._0_8_) {
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x108aca;
                    pmVar30 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                              ::operator[](pmVar1,&kStack_428);
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x108ae2;
                    memcpy(pmVar30,auStack_4b8,0x90);
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x108af3;
                    std::__cxx11::string::_M_assign((string *)&pmVar30->identifier);
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x108b04;
                    std::__cxx11::string::_M_assign((string *)&pmVar30->referrer);
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x108b18;
                    std::vector<Block,_std::allocator<Block>_>::operator=
                              (&pmVar30->blocks,&vStack_3e8);
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x108b2d;
                    std::deque<Board,_std::allocator<Board>_>::push_front
                              ((deque<Board,_std::allocator<Board>_> *)(auStack_510 + 8),
                               (value_type *)auStack_4b8);
                  }
                  if (vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x108b3f;
                    operator_delete(vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
                  }
                  if (a_Stack_408[0]._M_p != acStack_3f8) {
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x108b53;
                    operator_delete(a_Stack_408[0]._M_p);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)kStack_428._M_dataplus._M_p != &kStack_428.field_2) {
                    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)0x108b67;
                    operator_delete(kStack_428._M_dataplus._M_p);
                  }
                }
                iVar37 = iVar37 + 1;
              } while (iVar37 != 4);
            }
            uVar38 = uVar38 + 1;
            uVar28 = ((long)vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                            super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
          } while (uVar38 <= uVar28 && uVar28 - uVar38 != 0);
        }
        paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x108bba;
        pmVar30 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                  ::operator[](pmVar1,pkStack_588);
        this = pSStack_580;
        paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x108bd5;
        memcpy(pmVar30,(Solver *)auStack_3d0,0x90);
        paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x108be4;
        std::__cxx11::string::_M_assign((string *)&pmVar30->identifier);
        paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x108bf5;
        std::__cxx11::string::_M_assign((string *)&pmVar30->referrer);
        paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x108c09;
        std::vector<Block,_std::allocator<Block>_>::operator=
                  (&pmVar30->blocks,(vector<Block,_std::allocator<Block>_> *)auStack_5a0._8_8_);
      }
      if (vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x108c1b;
        operator_delete(vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (a_Stack_320[0]._M_p != acStack_310) {
        paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x108c2f;
        operator_delete(a_Stack_320[0]._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)kStack_340._M_dataplus._M_p != &kStack_340.field_2) {
        paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)0x108c43;
        operator_delete(kStack_340._M_dataplus._M_p);
      }
    } while (!bVar24);
    paStack_610 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)0x108c5b;
    std::deque<Board,_std::allocator<Board>_>::~deque
              ((deque<Board,_std::allocator<Board>_> *)(auStack_510 + 8));
    return;
  }
  if (algorithm == 0) {
    solveBFS(this);
    return;
  }
  pmVar27 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                          *)&stack0xfffffffffffff9f8,&(this->board).identifier);
  *pmVar27 = 0;
  pBStack_478 = (_Elt_pointer)0x0;
  pBStack_470 = (pointer)0x0;
  pBStack_488 = (_Elt_pointer)0x0;
  pBStack_480 = (_Elt_pointer)0x0;
  pBStack_498 = (_Elt_pointer)0x0;
  p_Stack_490 = (_Base_ptr)0x0;
  auStack_4b8._16_8_ = (_Elt_pointer)0x0;
  pBStack_4a0 = (_Elt_pointer)0x0;
  auStack_4b8._0_8_ = (_Map_pointer)0x0;
  auStack_4b8._8_8_ = 0;
  std::_Deque_base<Board,_std::allocator<Board>_>::_M_initialize_map
            ((_Deque_base<Board,_std::allocator<Board>_> *)auStack_4b8,0);
  std::_Deque_base<Board,_std::allocator<Board>_>::_Deque_base
            ((_Deque_base<Board,_std::allocator<Board>_> *)&pStack_6b0,
             (_Deque_base<Board,_std::allocator<Board>_> *)auStack_4b8);
  ppBVar23 = pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
             super__Deque_impl_data._M_start._M_node;
  pBVar22 = pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
            super__Deque_impl_data._M_start._M_last;
  pBVar21 = pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
            super__Deque_impl_data._M_start._M_first;
  pBVar20 = pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
            super__Deque_impl_data._M_start._M_cur;
  lVar39 = ((long)pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                  super__Deque_impl_data._M_start._M_last -
            (long)pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur >> 3) * 0x34f72c234f72c235 +
           ((long)pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur -
            (long)pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first >> 3) * 0x34f72c234f72c235 +
           (((long)pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node -
             (long)pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                   super__Deque_impl_data._M_start._M_node >> 3) + -1 +
           (ulong)(pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                   super__Deque_impl_data._M_finish._M_node == (_Map_pointer)0x0)) * 2;
  pStack_6b0.comp.steps =
       (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
        *)&stack0xfffffffffffff9f8;
  if (1 < lVar39) {
    uVar38 = lVar39 - 2U >> 1;
    lVar35 = (long)pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                   super__Deque_impl_data._M_start._M_cur -
             (long)pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                   super__Deque_impl_data._M_start._M_first;
    pBVar32 = pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur + uVar38;
    do {
      uVar28 = uVar38 + (lVar35 >> 3) * 0x34f72c234f72c235;
      if ((long)uVar28 < 0) {
        uVar31 = (long)uVar28 >> 1;
LAB_00108ecc:
        pBVar36 = ppBVar23[uVar31] + uVar28 + uVar31 * -2;
      }
      else {
        pBVar36 = pBVar32;
        if (1 < uVar28) {
          uVar31 = uVar28 >> 1;
          goto LAB_00108ecc;
        }
      }
      Board::Board((Board *)auStack_5a0,pBVar36);
      _Stack_6d0._M_cur = pBVar20;
      _Stack_6d0._M_first = pBVar21;
      _Stack_6d0._M_last = pBVar22;
      _Stack_6d0._M_node = ppBVar23;
      Board::Board((Board *)auStack_3d0,(Board *)auStack_5a0);
      std::
      __adjust_heap<std::_Deque_iterator<Board,Board&,Board*>,long,Board,__gnu_cxx::__ops::_Iter_comp_iter<Solver::solveDijkstra()::__0>>
                (&_Stack_6d0,uVar38,lVar39,(Board *)auStack_3d0,
                 (_Iter_comp_iter<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_1510_karakanb[P]unblock_me_solver_src_Solver_cpp:180:16)>
                  )&stack0xfffffffffffff9f8);
      if (vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (a_Stack_320[0]._M_p != acStack_310) {
        operator_delete(a_Stack_320[0]._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)kStack_340._M_dataplus._M_p != &kStack_340.field_2) {
        operator_delete(kStack_340._M_dataplus._M_p);
      }
      if (vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_4f0._M_p != &aStack_4e0) {
        operator_delete(_Stack_4f0._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_510._0_8_ != &aStack_500) {
        operator_delete((void *)auStack_510._0_8_);
      }
      uVar38 = uVar38 - 1;
      pBVar32 = pBVar32 + -1;
    } while (uVar38 != 0xffffffffffffffff);
  }
  std::deque<Board,_std::allocator<Board>_>::~deque
            ((deque<Board,_std::allocator<Board>_> *)auStack_4b8);
  std::
  priority_queue<Board,_std::deque<Board,_std::allocator<Board>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karakanb[P]unblock-me-solver/src/Solver.cpp:180:16)>
  ::push(&pStack_6b0,&this->board);
  pcStack_630 = acStack_310;
  pvStack_658 = &vStack_3e8;
  paStack_610 = &BStack_118.referrer.field_2;
  p_Stack_650 = a_Stack_408;
  paStack_638 = &BStack_2e8.referrer.field_2;
  paStack_640 = &kStack_340.field_2;
  paStack_618 = &BStack_200.identifier.field_2;
  paStack_620 = &BStack_118.identifier.field_2;
  paStack_648 = &BStack_2e8.identifier.field_2;
  pmVar1 = &this->pastSteps;
  p_Var2 = &(this->pastSteps)._M_t._M_impl.super__Rb_tree_header;
  do {
    if (pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.super__Deque_impl_data
        ._M_finish._M_cur ==
        pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.super__Deque_impl_data
        ._M_start._M_cur) break;
    Board::Board((Board *)auStack_4b8,
                 pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                 super__Deque_impl_data._M_start._M_cur);
    ppBVar23 = pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
               super__Deque_impl_data._M_start._M_node;
    pBVar22 = pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
              super__Deque_impl_data._M_start._M_last;
    pBVar21 = pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
              super__Deque_impl_data._M_start._M_first;
    pBVar20 = pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
              super__Deque_impl_data._M_start._M_cur;
    lVar39 = ((long)pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                    super__Deque_impl_data._M_start._M_last -
              (long)pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                    super__Deque_impl_data._M_start._M_cur >> 3) * 0x34f72c234f72c235;
    if (1 < (long)(((long)pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_cur -
                    (long)pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                          super__Deque_impl_data._M_finish._M_first >> 3) * 0x34f72c234f72c235 +
                   lVar39 + (((long)pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>.
                                    _M_impl.super__Deque_impl_data._M_finish._M_node -
                              (long)pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>.
                                    _M_impl.super__Deque_impl_data._M_start._M_node >> 3) + -1 +
                            (ulong)(pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>.
                                    _M_impl.super__Deque_impl_data._M_finish._M_node ==
                                   (_Map_pointer)0x0)) * 2)) {
      if (pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
          super__Deque_impl_data._M_finish._M_cur ==
          pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
          super__Deque_impl_data._M_finish._M_first) {
        pBStack_6e8 = pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_node[-1];
        ppBStack_6f0 = pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node + -1;
        pBVar32 = pBStack_6e8 + 2;
      }
      else {
        ppBStack_6f0 = pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                       super__Deque_impl_data._M_finish._M_node;
        pBStack_6e8 = pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                      super__Deque_impl_data._M_finish._M_first;
        pBVar32 = pStack_6b0.c.super__Deque_base<Board,_std::allocator<Board>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_cur;
      }
      _Stack_628._M_comp.steps =
           (anon_class_8_1_a8a4c247)(anon_class_8_1_a8a4c247)pStack_6b0.comp.steps;
      pBVar36 = pBVar32 + -1;
      Board::Board((Board *)auStack_5a0,pBVar36);
      memcpy(pBVar36,pBVar20,0x90);
      std::__cxx11::string::_M_assign((string *)&pBVar32[-1].identifier);
      std::__cxx11::string::_M_assign((string *)&pBVar32[-1].referrer);
      std::vector<Block,_std::allocator<Block>_>::operator=(&pBVar32[-1].blocks,&pBVar20->blocks);
      _Stack_6d0._M_cur = pBVar20;
      _Stack_6d0._M_first = pBVar21;
      _Stack_6d0._M_last = pBVar22;
      _Stack_6d0._M_node = ppBVar23;
      Board::Board((Board *)auStack_3d0,(Board *)auStack_5a0);
      std::
      __adjust_heap<std::_Deque_iterator<Board,Board&,Board*>,long,Board,__gnu_cxx::__ops::_Iter_comp_iter<Solver::solveDijkstra()::__0>>
                (&_Stack_6d0,0,
                 lVar39 + (((long)ppBStack_6f0 - (long)ppBVar23 >> 3) + -1 +
                          (ulong)(ppBStack_6f0 == (_Map_pointer)0x0)) * 2 +
                 ((long)pBVar36 - (long)pBStack_6e8 >> 3) * 0x34f72c234f72c235,(Board *)auStack_3d0,
                 _Stack_628);
      if (vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_300.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if (a_Stack_320[0]._M_p != pcStack_630) {
        operator_delete(a_Stack_320[0]._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)kStack_340._M_dataplus._M_p != paStack_640) {
        operator_delete(kStack_340._M_dataplus._M_p);
      }
      if (vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_Stack_4f0._M_p != &aStack_4e0) {
        operator_delete(_Stack_4f0._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)auStack_510._0_8_ != &aStack_500) {
        operator_delete((void *)auStack_510._0_8_);
      }
    }
    std::deque<Board,_std::allocator<Board>_>::pop_back(&pStack_6b0.c);
    bVar24 = Board::isCompleted((Board *)auStack_4b8);
    if (bVar24) {
      Board::Board(&BStack_2e8,(Board *)auStack_4b8);
      constructSolutionSteps(this,&BStack_2e8);
      if (BStack_2e8.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(BStack_2e8.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)BStack_2e8.referrer._M_dataplus._M_p != paStack_638) {
        operator_delete(BStack_2e8.referrer._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)BStack_2e8.identifier._M_dataplus._M_p != paStack_648) {
        operator_delete(BStack_2e8.identifier._M_dataplus._M_p);
      }
    }
    else {
      pmVar27 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              *)&stack0xfffffffffffff9f8,&kStack_428);
      if (vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
          super__Vector_impl_data._M_start) {
        uVar26 = *pmVar27 + 1;
        uVar38 = 0;
        do {
          bVar25 = Block::isHorizontal(vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>.
                                       _M_impl.super__Vector_impl_data._M_start + uVar38);
          if (bVar25) {
            iVar37 = 0;
            bVar25 = true;
            do {
              bVar33 = bVar25;
              pBVar3 = vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar38;
              uVar12 = pBVar3->id;
              uVar13 = pBVar3->row;
              uVar14 = pBVar3->column;
              uVar15 = pBVar3->length;
              block.length = uVar15;
              block.column = uVar14;
              block.row = uVar13;
              block.id = uVar12;
              block.direction =
                   vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar38].direction;
              bVar25 = Board::canMove((Board *)auStack_4b8,block,iVar37);
              if (bVar25) {
                pSVar34 = (Solver *)auStack_4b8;
                Board::Board(&BStack_118,(Board *)auStack_4b8);
                createMovedInstance((Board *)auStack_5a0,pSVar34,&BStack_118,(int)uVar38,iVar37);
                if (BStack_118.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(BStack_118.blocks.
                                  super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                                  super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)BStack_118.referrer._M_dataplus._M_p != paStack_610) {
                  operator_delete(BStack_118.referrer._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)BStack_118.identifier._M_dataplus._M_p != paStack_620) {
                  operator_delete(BStack_118.identifier._M_dataplus._M_p);
                }
                iVar29 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                         ::find(&pmVar1->_M_t,(key_type *)auStack_510);
                if (((_Rb_tree_header *)iVar29._M_node == p_Var2) ||
                   (pmVar27 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                            *)&stack0xfffffffffffff9f8,(key_type *)auStack_510),
                   uVar26 < *pmVar27)) {
                  pmVar27 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                          *)&stack0xfffffffffffff9f8,(key_type *)auStack_510);
                  *pmVar27 = uVar26;
                  pmVar30 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                            ::operator[](pmVar1,(key_type *)auStack_510);
                  memcpy(pmVar30,auStack_5a0,0x90);
                  std::__cxx11::string::_M_assign((string *)&pmVar30->identifier);
                  std::__cxx11::string::_M_assign((string *)&pmVar30->referrer);
                  std::vector<Block,_std::allocator<Block>_>::operator=
                            (&pmVar30->blocks,&vStack_4d0);
                  std::
                  priority_queue<Board,_std::deque<Board,_std::allocator<Board>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karakanb[P]unblock-me-solver/src/Solver.cpp:180:16)>
                  ::push(&pStack_6b0,(value_type *)auStack_5a0);
                }
                if (vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Stack_4f0._M_p != &aStack_4e0) {
                  operator_delete(_Stack_4f0._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)auStack_510._0_8_ != &aStack_500) {
                  operator_delete((void *)auStack_510._0_8_);
                }
              }
              iVar37 = 1;
              bVar25 = false;
            } while (bVar33);
          }
          else {
            iVar37 = 2;
            do {
              pBVar3 = vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar38;
              uVar16 = pBVar3->id;
              uVar17 = pBVar3->row;
              uVar18 = pBVar3->column;
              uVar19 = pBVar3->length;
              block_00.length = uVar19;
              block_00.column = uVar18;
              block_00.row = uVar17;
              block_00.id = uVar16;
              block_00.direction =
                   vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                   super__Vector_impl_data._M_start[uVar38].direction;
              bVar25 = Board::canMove((Board *)auStack_4b8,block_00,iVar37);
              if (bVar25) {
                pSVar34 = (Solver *)auStack_4b8;
                Board::Board(&BStack_200,(Board *)auStack_4b8);
                createMovedInstance((Board *)auStack_5a0,pSVar34,&BStack_200,(int)uVar38,iVar37);
                if (BStack_200.blocks.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(BStack_200.blocks.
                                  super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                                  super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)BStack_200.referrer._M_dataplus._M_p != &BStack_200.referrer.field_2) {
                  operator_delete(BStack_200.referrer._M_dataplus._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)BStack_200.identifier._M_dataplus._M_p != paStack_618) {
                  operator_delete(BStack_200.identifier._M_dataplus._M_p);
                }
                iVar29 = std::
                         _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                         ::find(&pmVar1->_M_t,(key_type *)auStack_510);
                if (((_Rb_tree_header *)iVar29._M_node == p_Var2) ||
                   (pmVar27 = std::
                              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                            *)&stack0xfffffffffffff9f8,(key_type *)auStack_510),
                   uVar26 < *pmVar27)) {
                  pmVar27 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                            ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
                                          *)&stack0xfffffffffffff9f8,(key_type *)auStack_510);
                  *pmVar27 = uVar26;
                  pmVar30 = std::
                            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                            ::operator[](pmVar1,(key_type *)auStack_510);
                  memcpy(pmVar30,auStack_5a0,0x90);
                  std::__cxx11::string::_M_assign((string *)&pmVar30->identifier);
                  std::__cxx11::string::_M_assign((string *)&pmVar30->referrer);
                  std::vector<Block,_std::allocator<Block>_>::operator=
                            (&pmVar30->blocks,&vStack_4d0);
                  std::
                  priority_queue<Board,_std::deque<Board,_std::allocator<Board>_>,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/karakanb[P]unblock-me-solver/src/Solver.cpp:180:16)>
                  ::push(&pStack_6b0,(value_type *)auStack_5a0);
                }
                if (vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                    super__Vector_impl_data._M_start != (pointer)0x0) {
                  operator_delete(vStack_4d0.super__Vector_base<Block,_std::allocator<Block>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)_Stack_4f0._M_p != &aStack_4e0) {
                  operator_delete(_Stack_4f0._M_p);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)auStack_510._0_8_ != &aStack_500) {
                  operator_delete((void *)auStack_510._0_8_);
                }
              }
              iVar37 = iVar37 + 1;
            } while (iVar37 != 4);
          }
          uVar38 = uVar38 + 1;
          uVar28 = ((long)vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                          super__Vector_impl_data._M_finish -
                    (long)vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                          super__Vector_impl_data._M_start >> 2) * -0x3333333333333333;
        } while (uVar38 <= uVar28 && uVar28 - uVar38 != 0);
      }
      pmVar30 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Board>_>_>
                ::operator[](pmVar1,&kStack_428);
      memcpy(pmVar30,(Solver *)auStack_4b8,0x90);
      std::__cxx11::string::_M_assign((string *)&pmVar30->identifier);
      std::__cxx11::string::_M_assign((string *)&pmVar30->referrer);
      std::vector<Block,_std::allocator<Block>_>::operator=(&pmVar30->blocks,pvStack_658);
    }
    if (vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(vStack_3e8.super__Vector_base<Block,_std::allocator<Block>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (a_Stack_408[0]._M_p != acStack_3f8) {
      operator_delete(a_Stack_408[0]._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)kStack_428._M_dataplus._M_p != &kStack_428.field_2) {
      operator_delete(kStack_428._M_dataplus._M_p);
    }
  } while (!bVar24);
  std::deque<Board,_std::allocator<Board>_>::~deque(&pStack_6b0.c);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
  ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
               *)&stack0xfffffffffffff9f8);
  return;
}

Assistant:

void Solver::solve(int algorithm) {
    if (algorithm == BFS) {
        this->solveBFS();
    } else if (algorithm == DFS) {
        this->solveDFS();
    } else {
        this->solveDijkstra();
    }
}